

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O3

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  MixedArena *this_00;
  tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> tVar1;
  Type indexType;
  Name name;
  Function *pFVar2;
  Memory *pMVar3;
  Block *this_01;
  Expression *pEVar4;
  Expression *pEVar5;
  Binary *this_02;
  LocalSet *item;
  undefined4 *puVar6;
  BinaryOp BVar7;
  ExpressionList *this_03;
  Name NVar8;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name name_00;
  Type local_98;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_90;
  HeapType local_88;
  SafeHeap *local_80;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_78;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Builder builder;
  pointer local_60;
  allocator_type local_31;
  
  NVar8 = getLoadName(&style);
  pFVar2 = Module::getFunctionOrNull(module,NVar8);
  if (pFVar2 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_80 = this;
    pMVar3 = Module::getMemory(module,name);
    tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
         (pMVar3->indexType).id;
    types._M_len = 2;
    types._M_array = (iterator)&func;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    wasm::Type::Type(&local_98,types);
    sig.results.id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    sig.params.id = local_98.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_90;
    local_90._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&func,__l,&local_31);
    name_00.super_IString.str._M_str = NVar8.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)&local_78;
    Builder::makeFunction
              (name_00,(HeapType)NVar8.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,(Expression *)&func);
    if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
        func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
      operator_delete((void *)func._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                      (long)local_60 -
                      (long)func._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    this_00 = &module->allocator;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
    this_01 = (Block *)MixedArena::allocSpace(this_00,0x40,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_01->name).super_IString.str._M_len = 0;
    (this_01->name).super_IString.str._M_str = (char *)0x0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (this_01->list).allocator = this_00;
    BVar7 = AddInt64;
    if ((pMVar3->indexType).id != 3) {
      BVar7 = AddInt32;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar4->_id = LocalGetId;
    pEVar4[1]._id = InvalidId;
    (pEVar4->type).id =
         (uintptr_t)
         tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pEVar5 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = BlockId;
    (pEVar5->type).id =
         (uintptr_t)
         tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    this_02 = (Binary *)MixedArena::allocSpace(this_00,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_02->op = BVar7;
    this_02->left = pEVar4;
    this_02->right = pEVar5;
    Binary::finalize(this_02);
    item = Builder::makeLocalSet((Builder *)&func,2,(Expression *)this_02);
    this_03 = &this_01->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    indexType.id = (pMVar3->indexType).id;
    pEVar4 = makeBoundsCheck(local_80,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                                      super_Expression.type,(Builder *)&func,2,(uint)style.bytes,
                             module,indexType,indexType.id == 3,
                             (Name)(pMVar3->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    if (1 < style.align.addr) {
      NVar8.super_IString.str._M_str._4_4_ =
           (int)((ulong)(pMVar3->super_Importable).super_Named.name.super_IString.str._M_str >> 0x20
                );
      NVar8.super_IString.str._0_12_ =
           *(undefined1 (*) [12])&(pMVar3->super_Importable).super_Named.name.super_IString.str;
      pEVar4 = makeAlignCheck(local_80,style.align,(Builder *)&func,2,module,NVar8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_03->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4)
      ;
    }
    pEVar5 = (Expression *)MixedArena::allocSpace(this_00,0x48,8);
    pEVar5->_id = LoadId;
    (pEVar5->type).id = 0;
    *(byte *)((long)&pEVar5[1]._id + 1) = 0;
    pEVar5[3].type.id = 0;
    *(undefined8 *)(pEVar5 + 4) = 0;
    pEVar5[1].type.id = 0;
    *(undefined8 *)(pEVar5 + 2) = 0;
    pEVar5->_id = style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._id;
    *(undefined4 *)&pEVar5->field_0x4 =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._4_4_;
    (pEVar5->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    *(ushort *)&pEVar5[1]._id = CONCAT11(style.signed_,style.bytes);
    pEVar5[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar5 + 2) = style.align.addr;
    pEVar5[2].type.id = style._40_8_;
    *(Expression **)(pEVar5 + 3) = style.ptr;
    pEVar5[3].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar5 + 4) = style.memory.super_IString.str._M_str;
    puVar6 = (undefined4 *)
             MixedArena::allocSpace
                       ((MixedArena *)
                        ((long)func._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x158)
                        ,0x18,8);
    *puVar6 = 8;
    puVar6[4] = 2;
    *(_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_> *)(puVar6 + 2) =
         tVar1.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined4 **)(pEVar5 + 3) = puVar6;
    pEVar4 = pEVar5;
    if (((char)pEVar5[2].type.id == '\x01') && (*(byte *)((long)&pEVar5[1]._id + 1) == 1)) {
      pEVar4 = Bits::makeSignExt(pEVar5,(uint)(byte)(char)pEVar5[1]._id,module);
      *(byte *)((long)&pEVar5[1]._id + 1) = 0;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_03->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar4);
    Block::finalize(this_01,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                            super_Expression.type);
    *(Block **)
     ((long)local_78._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = this_01;
    Module::addFunction(module,&local_78);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_78);
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto indexType = memory->indexType;
    auto funcSig = Signature({indexType, indexType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {indexType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, indexType),
                         builder.makeLocalGet(1, indexType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->indexType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, indexType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }